

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

SegmentBuilder * __thiscall capnp::MessageBuilder::getRootSegment(MessageBuilder *this)

{
  bool bVar1;
  BuilderArena *pBVar2;
  Fault local_c0;
  Fault f_1;
  word **local_b0;
  undefined1 local_a8 [8];
  DebugComparison<capnp::word_*&,_capnp::word_*> _kjCondition_1;
  Fault local_70;
  Fault f;
  Id<unsigned_int,_capnp::_::Segment> local_60;
  Id<unsigned_int,_capnp::_::Segment> local_5c;
  undefined1 local_58 [8];
  DebugComparison<kj::Id<unsigned_int,_capnp::_::Segment>,_kj::Id<unsigned_int,_capnp::_::Segment>_>
  _kjCondition;
  AllocateResult allocation;
  SegmentId local_1c;
  MessageBuilder *local_18;
  MessageBuilder *this_local;
  
  local_18 = this;
  if ((this->allocatedArena & 1U) == 0) {
    pBVar2 = arena(this);
    allocation.words = (word *)this;
    kj::ctor<capnp::_::BuilderArena,capnp::MessageBuilder*>
              (pBVar2,(MessageBuilder **)&allocation.words);
    this->allocatedArena = true;
    pBVar2 = arena(this);
    join_0x00000010_0x00000000_ = capnp::_::BuilderArena::allocate(pBVar2,1);
    local_60.value =
         (uint)capnp::_::SegmentReader::getSegmentId((SegmentReader *)_kjCondition._24_8_);
    local_5c.value =
         (uint)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
    kj::Id<unsigned_int,_capnp::_::Segment>::Id
              ((Id<unsigned_int,_capnp::_::Segment> *)((long)&f.exception + 4),0);
    kj::_::DebugExpression<kj::Id<unsigned_int,capnp::_::Segment>>::operator==
              ((DebugComparison<kj::Id<unsigned_int,_capnp::_::Segment>,_kj::Id<unsigned_int,_capnp::_::Segment>_>
                *)local_58,(DebugExpression<kj::Id<unsigned_int,capnp::_::Segment>> *)&local_5c,
               (Id<unsigned_int,_capnp::_::Segment> *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Id<unsigned_int,capnp::_::Segment>,kj::Id<unsigned_int,capnp::_::Segment>>&,char_const(&)[59]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                 ,0x8b,FAILED,"allocation.segment->getSegmentId() == _::SegmentId(0)",
                 "_kjCondition,\"First allocated word of new arena was not in segment ID 0.\"",
                 (DebugComparison<kj::Id<unsigned_int,_capnp::_::Segment>,_kj::Id<unsigned_int,_capnp::_::Segment>_>
                  *)local_58,
                 (char (*) [59])"First allocated word of new arena was not in segment ID 0.");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    local_b0 = (word **)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(word **)&allocation
                                  );
    f_1.exception =
         (Exception *)
         capnp::_::SegmentBuilder::getPtrUnchecked((SegmentBuilder *)_kjCondition._24_8_,0);
    kj::_::DebugExpression<capnp::word*&>::operator==
              ((DebugComparison<capnp::word_*&,_capnp::word_*> *)local_a8,
               (DebugExpression<capnp::word*&> *)&local_b0,(word **)&f_1);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word*&,capnp::word*>&,char_const(&)[73]>
                (&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                 ,0x8d,FAILED,
                 "allocation.words == allocation.segment->getPtrUnchecked(ZERO * WORDS)",
                 "_kjCondition,\"First allocated word of new arena was not the first word in its segment.\""
                 ,(DebugComparison<capnp::word_*&,_capnp::word_*> *)local_a8,
                 (char (*) [73])
                 "First allocated word of new arena was not the first word in its segment.");
      kj::_::Debug::Fault::fatal(&local_c0);
    }
    this_local = (MessageBuilder *)_kjCondition._24_8_;
  }
  else {
    pBVar2 = arena(this);
    kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_1c,0);
    this_local = (MessageBuilder *)capnp::_::BuilderArena::getSegment(pBVar2,local_1c);
  }
  return (SegmentBuilder *)this_local;
}

Assistant:

_::SegmentBuilder* MessageBuilder::getRootSegment() {
  if (allocatedArena) {
    return arena()->getSegment(_::SegmentId(0));
  } else {
    static_assert(sizeof(_::BuilderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a BuilderArena.  Please increase it.");
    kj::ctor(*arena(), this);
    allocatedArena = true;

    auto allocation = arena()->allocate(POINTER_SIZE_IN_WORDS);

    KJ_ASSERT(allocation.segment->getSegmentId() == _::SegmentId(0),
        "First allocated word of new arena was not in segment ID 0.");
    KJ_ASSERT(allocation.words == allocation.segment->getPtrUnchecked(ZERO * WORDS),
        "First allocated word of new arena was not the first word in its segment.");
    return allocation.segment;
  }
}